

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O0

void __thiscall
Js::DelayedFreeArrayBuffer::CheckAndMarkObject(DelayedFreeArrayBuffer *this,void *candidate)

{
  void *local_18;
  void *candidate_local;
  DelayedFreeArrayBuffer *this_local;
  
  local_18 = candidate;
  candidate_local = this;
  SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount>::
  Map<Js::DelayedFreeArrayBuffer::CheckAndMarkObject(void*)::__0>
            ((SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount> *
             )this,(anon_class_8_1_33ea1c23_for_fn)&local_18);
  return;
}

Assistant:

void DelayedFreeArrayBuffer::CheckAndMarkObject(void * candidate)
    {
        this->listOfBuffers.Map([&](Js::ArrayBufferContentForDelayedFreeBase* item) {
            if (!item->IsMarked() && item->IsAddressPartOfBuffer(candidate))
            {
                item->SetMarkBit(true);
            }
        });
    }